

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O3

int mg_init_session_static_vars(void)

{
  int iVar1;
  mg_value *value;
  
  value = mg_value_make_integer(-1);
  if (value != (mg_value *)0x0) {
    mg_default_pull_extra_map = mg_map_make_empty(1);
    if ((mg_default_pull_extra_map != (mg_map *)0x0) &&
       (iVar1 = mg_map_insert_unsafe(mg_default_pull_extra_map,"n",value), iVar1 == 0)) {
      return 0;
    }
    mg_value_destroy(value);
  }
  if (mg_default_pull_extra_map != (mg_map *)0x0) {
    mg_map_destroy(mg_default_pull_extra_map);
  }
  return -0xb;
}

Assistant:

int mg_init_session_static_vars(void) {
  mg_value *n_val = mg_value_make_integer(-1);
  if (!n_val) {
    goto fatal_failure;
  }
  mg_default_pull_extra_map = mg_map_make_empty(1);
  if (!mg_default_pull_extra_map) {
    goto fatal_failure;
  }
  if (mg_map_insert_unsafe(mg_default_pull_extra_map, "n", n_val) != 0) {
    goto fatal_failure;
  }
  return MG_SUCCESS;

fatal_failure:
  if (n_val) {
    mg_value_destroy(n_val);
  }
  if (mg_default_pull_extra_map) {
    mg_map_destroy(mg_default_pull_extra_map);
  }
  return MG_ERROR_CLIENT_ERROR;
}